

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void duckdb_brotli::BrotliCreateBackwardReferences
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int iVar1;
  size_t *in_stack_ffffffffffffffc0;
  
  if ((params->dictionary).compound.num_chunks != 0) {
    iVar1 = (params->hasher).type;
    if (iVar1 < 0x29) {
      if (iVar1 == 5) {
        CreateBackwardReferencesDH5
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
      if (iVar1 == 6) {
        CreateBackwardReferencesDH6
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
      if (iVar1 == 0x28) {
        CreateBackwardReferencesDH40
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
    }
    else if (iVar1 < 0x37) {
      if (iVar1 == 0x29) {
        CreateBackwardReferencesDH41
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
      if (iVar1 == 0x2a) {
        CreateBackwardReferencesDH42
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
    }
    else {
      if (iVar1 == 0x37) {
        CreateBackwardReferencesDH55
                  (num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)params,
                   (BrotliEncoderParams *)hasher,(Hasher *)dist_cache,(int *)last_insert_len,
                   (size_t *)commands,(Command *)num_commands,num_literals,in_stack_ffffffffffffffc0
                  );
        return;
      }
      if (iVar1 == 0x41) {
        CreateBackwardReferencesDH65
                  (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                   dist_cache,last_insert_len,commands,num_commands,num_literals);
        return;
      }
    }
  }
  iVar1 = (params->hasher).type;
  if (iVar1 < 0x23) {
    switch(iVar1) {
    case 2:
      CreateBackwardReferencesNH2
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    case 3:
      CreateBackwardReferencesNH3
                (num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)params,
                 (BrotliEncoderParams *)hasher,(Hasher *)dist_cache,(int *)last_insert_len,
                 (size_t *)commands,(Command *)num_commands,num_literals,in_stack_ffffffffffffffc0);
      return;
    case 4:
      CreateBackwardReferencesNH4
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    case 5:
      CreateBackwardReferencesNH5
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    case 6:
      CreateBackwardReferencesNH6
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    }
  }
  else if (iVar1 < 0x36) {
    switch(iVar1) {
    case 0x23:
      CreateBackwardReferencesNH35
                (num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)params,
                 (BrotliEncoderParams *)hasher,(Hasher *)dist_cache,(int *)last_insert_len,
                 (size_t *)commands,(Command *)num_commands,num_literals,in_stack_ffffffffffffffc0);
      return;
    case 0x28:
      CreateBackwardReferencesNH40
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    case 0x29:
      CreateBackwardReferencesNH41
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    case 0x2a:
      CreateBackwardReferencesNH42
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    }
  }
  else {
    if (iVar1 == 0x36) {
      CreateBackwardReferencesNH54
                (num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)params,
                 (BrotliEncoderParams *)hasher,(Hasher *)dist_cache,(int *)last_insert_len,
                 (size_t *)commands,(Command *)num_commands,num_literals,in_stack_ffffffffffffffc0);
      return;
    }
    if (iVar1 == 0x37) {
      CreateBackwardReferencesNH55
                (num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)params,
                 (BrotliEncoderParams *)hasher,(Hasher *)dist_cache,(int *)last_insert_len,
                 (size_t *)commands,(Command *)num_commands,num_literals,in_stack_ffffffffffffffc0);
      return;
    }
    if (iVar1 == 0x41) {
      CreateBackwardReferencesNH65
                (num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,hasher,
                 dist_cache,last_insert_len,commands,num_commands,num_literals);
      return;
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliCreateBackwardReferences(size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  if (params->dictionary.compound.num_chunks != 0) {
    switch (params->hasher.type) {
#define CASE_(N)                                                    \
      case N:                                                       \
        CreateBackwardReferencesDH ## N(num_bytes,                  \
            position, ringbuffer, ringbuffer_mask,                  \
            literal_context_lut, params, hasher, dist_cache,        \
            last_insert_len, commands, num_commands, num_literals); \
        return;
      CASE_(5)
      CASE_(6)
      CASE_(40)
      CASE_(41)
      CASE_(42)
      CASE_(55)
      CASE_(65)
#undef CASE_
      default:
        BROTLI_DCHECK(false);
        break;
    }
  }

  switch (params->hasher.type) {
#define CASE_(N)                                                  \
    case N:                                                       \
      CreateBackwardReferencesNH ## N(num_bytes,                  \
          position, ringbuffer, ringbuffer_mask,                  \
          literal_context_lut, params, hasher, dist_cache,        \
          last_insert_len, commands, num_commands, num_literals); \
      return;
    FOR_GENERIC_HASHERS(CASE_)
#undef CASE_
    default:
      BROTLI_DCHECK(false);
      break;
  }
}